

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CompilationUnitSymbol::addMembers(CompilationUnitSymbol *this,SyntaxNode *syntax)

{
  bool bVar1;
  SyntaxNode *in_RSI;
  long in_RDI;
  MemberSyntax *member;
  iterator __end5;
  iterator __begin5;
  SyntaxList<slang::syntax::MemberSyntax> *__range5;
  CompilationUnitSyntax *cu;
  Scope *in_stack_00000058;
  TimeScale *in_stack_00000060;
  SyntaxNode *in_stack_00000608;
  Scope *in_stack_00000610;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffb0;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_28;
  SyntaxList<slang::syntax::MemberSyntax> *local_20;
  CompilationUnitSyntax *local_18;
  SyntaxNode *local_10;
  
  if (in_RSI->kind == TimeUnitsDeclaration) {
    local_10 = in_RSI;
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0xc13ca7);
    if (!bVar1) {
      std::optional<slang::TimeScale>::emplace<>
                ((optional<slang::TimeScale> *)in_stack_ffffffffffffffb0);
    }
    std::optional<slang::TimeScale>::operator*((optional<slang::TimeScale> *)0xc13cc7);
    slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>(local_10);
    SemanticFacts::populateTimeScale
              (in_stack_00000060,in_stack_00000058,(TimeUnitsDeclarationSyntax *)this,
               (optional<slang::SourceRange> *)syntax,(optional<slang::SourceRange> *)cu,
               __range5._7_1_);
  }
  else if (in_RSI->kind == CompilationUnit) {
    local_18 = slang::syntax::SyntaxNode::as<slang::syntax::CompilationUnitSyntax>(in_RSI);
    bVar1 = std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)0xc13d56);
    if (!bVar1) {
      *(undefined1 *)(in_RDI + 0x88) = 1;
      local_20 = &local_18->members;
      local_28._M_current =
           (MemberSyntax **)
           std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (in_stack_ffffffffffffffa8);
      std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                (in_stack_ffffffffffffffb8);
      while (bVar1 = __gnu_cxx::
                     operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                               (in_stack_ffffffffffffffb0,
                                (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                 *)in_stack_ffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
        ::operator*(&local_28);
        Scope::addMembers(in_stack_00000610,in_stack_00000608);
        __gnu_cxx::
        __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
        ::operator++(&local_28);
      }
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x88) = 1;
    Scope::addMembers(in_stack_00000610,in_stack_00000608);
  }
  return;
}

Assistant:

void CompilationUnitSymbol::addMembers(const SyntaxNode& syntax) {
    if (syntax.kind == SyntaxKind::TimeUnitsDeclaration) {
        if (!timeScale)
            timeScale.emplace();

        SemanticFacts::populateTimeScale(*timeScale, *this, syntax.as<TimeUnitsDeclarationSyntax>(),
                                         unitsRange, precisionRange, !anyMembers);
    }
    else if (syntax.kind == SyntaxKind::CompilationUnit) {
        auto& cu = syntax.as<CompilationUnitSyntax>();
        if (!cu.members.empty()) {
            anyMembers = true;
            for (auto member : cu.members)
                Scope::addMembers(*member);
        }
    }
    else {
        anyMembers = true;
        Scope::addMembers(syntax);
    }
}